

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_hdwallet.cpp
# Opt level: O3

ExtPubkey * __thiscall
cfd::core::HDWallet::GeneratePubkey
          (ExtPubkey *__return_storage_ptr__,HDWallet *this,NetType network_type,uint32_t child_num)

{
  initializer_list<unsigned_int> __l;
  vector<unsigned_int,_std::allocator<unsigned_int>_> path;
  allocator_type local_3d;
  uint32_t local_3c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_38;
  
  __l._M_len = 1;
  __l._M_array = &local_3c;
  local_3c = child_num;
  ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_38,__l,&local_3d);
  GeneratePubkey(__return_storage_ptr__,this,network_type,&local_38);
  if (local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

ExtPubkey HDWallet::GeneratePubkey(
    NetType network_type, uint32_t child_num) const {
  std::vector<uint32_t> path = {child_num};
  return GeneratePubkey(network_type, path);
}